

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audit_regressor.cc
# Opt level: O0

base_learner * audit_regressor_setup(options_i *options,vw *all)

{
  vw *pvVar1;
  byte bVar2;
  ulong uVar3;
  undefined8 uVar4;
  pointer paVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  io_buf *piVar7;
  base_learner *base;
  single_learner *this;
  learner<audit_regressor_data,_example> *this_00;
  vw *in_RSI;
  long *in_RDI;
  learner<audit_regressor_data,_example> *ret;
  free_ptr<audit_regressor_data> dat;
  stringstream __msg_1;
  stringstream __msg;
  option_group_definition new_options;
  string out_file;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff988;
  vw *in_stack_fffffffffffff990;
  string *in_stack_fffffffffffff998;
  string *in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  int plineNumber;
  learner<audit_regressor_data,_example> *this_01;
  char *in_stack_fffffffffffff9b8;
  vw_exception *in_stack_fffffffffffff9c0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff9d8;
  option_group_definition *in_stack_fffffffffffff9e0;
  learner<audit_regressor_data,_example> local_5d0 [23];
  undefined1 local_5b9;
  stringstream local_598 [16];
  stringstream local_588 [216];
  learner<char,_char> *in_stack_fffffffffffffb50;
  stringstream local_3e8 [16];
  ostream local_3d8;
  undefined4 local_260;
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8 [2];
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [56];
  string local_38 [32];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  plineNumber = (int)((ulong)in_stack_fffffffffffff9b0 >> 0x20);
  local_18 = in_RSI;
  local_10 = in_RDI;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"Audit Regressor",&local_91);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff990,
             (string *)in_stack_fffffffffffff988);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"audit_regressor",&local_209);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff998,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff990);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(local_1e8,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,
             "stores feature names and their regressor values. Same dataset must be used for both regressor training and this mode."
             ,&local_231);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff990,(string *)in_stack_fffffffffffff988);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
  VW::config::option_group_definition::add<std::__cxx11::string>
            (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff990);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff990);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  (**(code **)*local_10)(local_10,local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"audit_regressor",&local_259);
  bVar2 = (**(code **)(*local_10 + 8))(local_10,local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_3e8);
      std::operator<<(&local_3d8,"audit_regressor argument (output filename) is missing.");
      uVar4 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,plineNumber,
                 in_stack_fffffffffffff9a8);
      __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if (1 < local_18->numpasses) {
      std::__cxx11::stringstream::stringstream(local_598);
      std::operator<<((ostream *)(local_598 + 0x10),
                      "audit_regressor can\'t be used with --passes > 1.");
      local_5b9 = 1;
      uVar4 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,plineNumber,
                 in_stack_fffffffffffff9a8);
      local_5b9 = 0;
      __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    local_18->audit = true;
    scoped_calloc_or_throw<audit_regressor_data>();
    pvVar1 = local_18;
    paVar5 = std::unique_ptr<audit_regressor_data,_void_(*)(void_*)>::operator->
                       ((unique_ptr<audit_regressor_data,_void_(*)(void_*)> *)0x334243);
    paVar5->all = pvVar1;
    pvVar6 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0x18);
    (pvVar6->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar6->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar6->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x334274);
    paVar5 = std::unique_ptr<audit_regressor_data,_void_(*)(void_*)>::operator->
                       ((unique_ptr<audit_regressor_data,_void_(*)(void_*)> *)0x334281);
    paVar5->ns_pre = pvVar6;
    piVar7 = (io_buf *)operator_new(0xa8);
    io_buf::io_buf((io_buf *)0x3342a5);
    this_01 = local_5d0;
    paVar5 = std::unique_ptr<audit_regressor_data,_void_(*)(void_*)>::operator->
                       ((unique_ptr<audit_regressor_data,_void_(*)(void_*)> *)0x3342b9);
    paVar5->out_file = piVar7;
    paVar5 = std::unique_ptr<audit_regressor_data,_void_(*)(void_*)>::operator->
                       ((unique_ptr<audit_regressor_data,_void_(*)(void_*)> *)0x3342cc);
    piVar7 = paVar5->out_file;
    uVar4 = std::__cxx11::string::c_str();
    (**piVar7->_vptr_io_buf)(piVar7,uVar4,(ulong)(local_18->stdin_off & 1),2);
    base = setup_base((options_i *)in_stack_fffffffffffff998,in_stack_fffffffffffff990);
    this = LEARNER::as_singleline<char,char>(in_stack_fffffffffffffb50);
    this_00 = LEARNER::init_learner<audit_regressor_data,example,LEARNER::learner<char,example>>
                        ((free_ptr<audit_regressor_data> *)this_01,(learner<char,_example> *)base,
                         (_func_void_audit_regressor_data_ptr_learner<char,_example>_ptr_example_ptr
                          *)this,(_func_void_audit_regressor_data_ptr_learner<char,_example>_ptr_example_ptr
                                  *)in_stack_fffffffffffff998,(size_t)in_stack_fffffffffffff990);
    LEARNER::learner<audit_regressor_data,_example>::set_end_examples
              (this_01,(_func_void_audit_regressor_data_ptr *)base);
    LEARNER::learner<audit_regressor_data,_example>::set_finish_example(this_00,finish_example);
    LEARNER::learner<audit_regressor_data,_example>::set_finish
              (this_01,(_func_void_audit_regressor_data_ptr *)base);
    LEARNER::learner<audit_regressor_data,_example>::set_init_driver
              (this_01,(_func_void_audit_regressor_data_ptr *)base);
    in_stack_fffffffffffff990 = (vw *)LEARNER::make_base<audit_regressor_data,example>(this_00);
    local_260 = 1;
    local_8 = in_stack_fffffffffffff990;
    std::unique_ptr<audit_regressor_data,_void_(*)(void_*)>::~unique_ptr
              ((unique_ptr<audit_regressor_data,_void_(*)(void_*)> *)this);
  }
  else {
    local_8 = (vw *)0x0;
    local_260 = 1;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff990);
  std::__cxx11::string::~string(local_38);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* audit_regressor_setup(options_i& options, vw& all)
{
  string out_file;

  option_group_definition new_options("Audit Regressor");
  new_options.add(make_option("audit_regressor", out_file)
                      .keep()
                      .help("stores feature names and their regressor values. Same dataset must be used for both "
                            "regressor training and this mode."));
  options.add_and_parse(new_options);

  if (!options.was_supplied("audit_regressor"))
    return nullptr;

  if (out_file.empty())
    THROW("audit_regressor argument (output filename) is missing.");

  if (all.numpasses > 1)
    THROW("audit_regressor can't be used with --passes > 1.");

  all.audit = true;

  auto dat = scoped_calloc_or_throw<audit_regressor_data>();
  dat->all = &all;
  dat->ns_pre = new vector<string>();  // explicitly invoking vector's constructor
  dat->out_file = new io_buf();
  dat->out_file->open_file(out_file.c_str(), all.stdin_off, io_buf::WRITE);

  LEARNER::learner<audit_regressor_data, example>& ret =
      LEARNER::init_learner(dat, as_singleline(setup_base(options, all)), audit_regressor, audit_regressor, 1);
  ret.set_end_examples(end_examples);
  ret.set_finish_example(finish_example);
  ret.set_finish(finish);
  ret.set_init_driver(init_driver);

  return LEARNER::make_base<audit_regressor_data>(ret);
}